

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyWriteTLASCompactedSizeAttribs
               (IRenderDevice *pDevice,WriteTLASCompactedSizeAttribs *Attribs)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char (*in_RCX) [70];
  ITopLevelAS *pIVar3;
  IBuffer *pIVar4;
  string msg;
  string local_38;
  
  pIVar3 = Attribs->pTLAS;
  if (pIVar3 == (ITopLevelAS *)0x0) {
    FormatString<char[48],char[24]>
              (&local_38,(Diligent *)"Write compacted TLAS size attribs are invalid: ",
               (char (*) [48])"pTLAS must not be null.",(char (*) [24])in_RCX);
    in_RCX = (char (*) [70])0x427;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VerifyWriteTLASCompactedSizeAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x427);
    std::__cxx11::string::~string((string *)&local_38);
    pIVar3 = Attribs->pTLAS;
  }
  iVar1 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 0xc) & 2) == 0) {
    FormatString<char[48],char[70]>
              (&local_38,(Diligent *)"Write compacted TLAS size attribs are invalid: ",
               (char (*) [48])
               "pTLAS was not created with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.",in_RCX);
    in_RCX = (char (*) [70])0x429;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VerifyWriteTLASCompactedSizeAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x429);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pIVar4 = Attribs->pDestBuffer;
  if (pIVar4 == (IBuffer *)0x0) {
    FormatString<char[48],char[30]>
              (&local_38,(Diligent *)"Write compacted TLAS size attribs are invalid: ",
               (char (*) [48])"pDestBuffer must not be null.",(char (*) [30])in_RCX);
    in_RCX = (char (*) [70])0x42b;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VerifyWriteTLASCompactedSizeAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x42b);
    std::__cxx11::string::~string((string *)&local_38);
    pIVar4 = Attribs->pDestBuffer;
  }
  iVar1 = (*(pIVar4->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(ulong *)(CONCAT44(extraout_var_00,iVar1) + 8) < Attribs->DestBufferOffset + 8) {
    FormatString<char[48],char[26]>
              (&local_38,(Diligent *)"Write compacted TLAS size attribs are invalid: ",
               (char (*) [48])"pDestBuffer is too small.",(char (*) [26])in_RCX);
    in_RCX = (char (*) [70])0x42e;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VerifyWriteTLASCompactedSizeAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x42e);
    std::__cxx11::string::~string((string *)&local_38);
  }
  iVar2 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  if ((*(int *)CONCAT44(extraout_var_01,iVar2) == 2) &&
     ((*(byte *)(CONCAT44(extraout_var_00,iVar1) + 0x10) & 0x80) == 0)) {
    FormatString<char[48],char[68]>
              (&local_38,(Diligent *)"Write compacted TLAS size attribs are invalid: ",
               (char (*) [48])"pDestBuffer must have been created with BIND_UNORDERED_ACCESS flag.",
               (char (*) [68])in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VerifyWriteTLASCompactedSizeAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x433);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return true;
}

Assistant:

bool VerifyWriteTLASCompactedSizeAttribs(const IRenderDevice* pDevice, const WriteTLASCompactedSizeAttribs& Attribs)
{
#define CHECK_WRITE_TLAS_SIZE_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Write compacted TLAS size attribs are invalid: ", __VA_ARGS__)

    CHECK_WRITE_TLAS_SIZE_ATTRIBS(Attribs.pTLAS != nullptr, "pTLAS must not be null.");
    CHECK_WRITE_TLAS_SIZE_ATTRIBS((Attribs.pTLAS->GetDesc().Flags & RAYTRACING_BUILD_AS_ALLOW_COMPACTION) == RAYTRACING_BUILD_AS_ALLOW_COMPACTION,
                                  "pTLAS was not created with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.");

    CHECK_WRITE_TLAS_SIZE_ATTRIBS(Attribs.pDestBuffer != nullptr, "pDestBuffer must not be null.");

    const BufferDesc& DstDesc = Attribs.pDestBuffer->GetDesc();
    CHECK_WRITE_TLAS_SIZE_ATTRIBS(Attribs.DestBufferOffset + sizeof(Uint64) <= DstDesc.Size, "pDestBuffer is too small.");

    if (pDevice->GetDeviceInfo().Type == RENDER_DEVICE_TYPE_D3D12)
    {
        CHECK_WRITE_TLAS_SIZE_ATTRIBS((DstDesc.BindFlags & BIND_UNORDERED_ACCESS) == BIND_UNORDERED_ACCESS,
                                      "pDestBuffer must have been created with BIND_UNORDERED_ACCESS flag.");
    }

#undef CHECK_WRITE_TLAS_SIZE_ATTRIBS

    return true;
}